

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_40(QPDF *pdf,char *arg2)

{
  QPDFWriter w;
  QPDFWriter aQStack_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  if (arg2 != (char *)0x0) {
    QPDFWriter::QPDFWriter(aQStack_18,pdf,arg2);
    QPDFWriter::setPCLm(SUB81(aQStack_18,0));
    QPDFWriter::setStaticID(SUB81(aQStack_18,0));
    QPDFWriter::write();
    if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    }
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x565,"void test_40(QPDF &, const char *)");
}

Assistant:

static void
test_40(QPDF& pdf, char const* arg2)
{
    // Write PCLm. This requires specially crafted PDF files. This
    // feature was implemented by Sahil Arora
    // <sahilarora.535@gmail.com> as part of a Google Summer of
    // Code project in 2017.
    assert(arg2 != nullptr);
    QPDFWriter w(pdf, arg2);
    w.setPCLm(true);
    w.setStaticID(true);
    w.write();
}